

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

TaprootSpendData * __thiscall TaprootBuilder::GetSpendData(TaprootBuilder *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  size_type sVar5;
  NodeInfo *pNVar6;
  reference pLVar7;
  byte *pbVar8;
  uchar *puVar9;
  long in_RSI;
  TaprootSpendData *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar10;
  LeafInfo *leaf;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *__range2;
  TaprootSpendData *spd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> control_block;
  const_iterator __end2;
  const_iterator __begin2;
  TaprootSpendData *in_stack_fffffffffffffe88;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
  *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  _Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffea0;
  key_type *in_stack_fffffffffffffea8;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffeb8;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = IsComplete((TaprootBuilder *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)
                    );
  if (!bVar4) {
    __assert_fail("IsComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x194,"TaprootSpendData TaprootBuilder::GetSpendData() const");
  }
  bVar4 = XOnlyPubKey::IsFullyValid
                    ((XOnlyPubKey *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  if (!bVar4) {
    __assert_fail("m_output_key.IsFullyValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x195,"TaprootSpendData TaprootBuilder::GetSpendData() const");
  }
  TaprootSpendData::TaprootSpendData(in_stack_fffffffffffffe88);
  sVar5 = std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)in_stack_fffffffffffffe88);
  if (sVar5 == 0) {
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    uint256::uint256((uint256 *)in_stack_fffffffffffffe88);
  }
  else {
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (size_type)in_stack_fffffffffffffe90);
    pNVar6 = std::optional<TaprootBuilder::NodeInfo>::operator->
                       ((optional<TaprootBuilder::NodeInfo> *)in_stack_fffffffffffffe88);
    local_28 = *(undefined8 *)(pNVar6->hash).super_base_blob<256U>.m_data._M_elems;
    uStack_20 = *(undefined8 *)((pNVar6->hash).super_base_blob<256U>.m_data._M_elems + 8);
    local_18 = *(undefined8 *)((pNVar6->hash).super_base_blob<256U>.m_data._M_elems + 0x10);
    uStack_10 = *(undefined8 *)((pNVar6->hash).super_base_blob<256U>.m_data._M_elems + 0x18);
  }
  *(undefined8 *)(in_RDI->merkle_root).super_base_blob<256U>.m_data._M_elems = local_28;
  *(undefined8 *)((in_RDI->merkle_root).super_base_blob<256U>.m_data._M_elems + 8) = uStack_20;
  *(undefined8 *)((in_RDI->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10) = local_18;
  *(undefined8 *)((in_RDI->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_10;
  *(undefined8 *)(in_RDI->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)((in_RDI->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
       *(undefined8 *)(in_RSI + 0x28);
  *(undefined8 *)((in_RDI->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)((in_RDI->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) =
       *(undefined8 *)(in_RSI + 0x38);
  sVar5 = std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)in_stack_fffffffffffffe88);
  if (sVar5 != 0) {
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (size_type)in_stack_fffffffffffffe90);
    std::optional<TaprootBuilder::NodeInfo>::operator->
              ((optional<TaprootBuilder::NodeInfo> *)in_stack_fffffffffffffe88);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::begin
              (in_stack_fffffffffffffe90);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::end
              (in_stack_fffffffffffffe90);
    while (bVar4 = __gnu_cxx::
                   operator==<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                             ((__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                              (__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                               *)in_stack_fffffffffffffe90), ((bVar4 ^ 0xffU) & 1) != 0) {
      pLVar7 = __gnu_cxx::
               __normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
               ::operator*((__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                            *)in_stack_fffffffffffffe88);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88)
      ;
      std::vector<uint256,_std::allocator<uint256>_>::size
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe88);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&in_stack_fffffffffffffea8->first,(size_type)in_stack_fffffffffffffea0._M_node);
      iVar2 = pLVar7->leaf_version;
      bVar1 = *(byte *)(in_RSI + 0x60);
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                          (size_type)in_stack_fffffffffffffe90);
      *pbVar8 = (byte)iVar2 | bVar1 & 1;
      XOnlyPubKey::begin(&in_stack_fffffffffffffe88->internal_key);
      XOnlyPubKey::end(&in_stack_fffffffffffffe88->internal_key);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                  (difference_type)in_stack_fffffffffffffe90);
      std::
      copy<unsigned_char_const*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((uchar *)in_stack_fffffffffffffea0._M_node,
                 (uchar *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffeb8);
      sVar5 = std::vector<uint256,_std::allocator<uint256>_>::size
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe88);
      if (sVar5 != 0) {
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)
                   CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   (size_type)in_stack_fffffffffffffe90);
        base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffe88);
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)
                   CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   (size_type)in_stack_fffffffffffffe90);
        puVar9 = base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffe88);
        sVar5 = std::vector<uint256,_std::allocator<uint256>_>::size
                          ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffeb8._M_current = puVar9 + sVar5 * 0x20;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe90);
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                    (difference_type)in_stack_fffffffffffffe90);
        std::
        copy<unsigned_char_const*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)in_stack_fffffffffffffea0._M_node,
                   (uchar *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffeb8);
      }
      this_00 = &in_RDI->scripts;
      std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>::
      pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int,_true>
                ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90,
                 (int *)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffea8 =
           (key_type *)
           std::
           map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
           ::operator[](this_00,in_stack_fffffffffffffea8);
      pVar10 = std::
               set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::insert((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                        (value_type *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffea0 = pVar10.first._M_node;
      in_stack_fffffffffffffe9f = pVar10.second;
      std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>::~pair
                ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                 in_stack_fffffffffffffe88);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      __gnu_cxx::
      __normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
      ::operator++((__normal_iterator<const_TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                    *)in_stack_fffffffffffffe88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

TaprootSpendData TaprootBuilder::GetSpendData() const
{
    assert(IsComplete());
    assert(m_output_key.IsFullyValid());
    TaprootSpendData spd;
    spd.merkle_root = m_branch.size() == 0 ? uint256() : m_branch[0]->hash;
    spd.internal_key = m_internal_key;
    if (m_branch.size()) {
        // If any script paths exist, they have been combined into the root m_branch[0]
        // by now. Compute the control block for each of its tracked leaves, and put them in
        // spd.scripts.
        for (const auto& leaf : m_branch[0]->leaves) {
            std::vector<unsigned char> control_block;
            control_block.resize(TAPROOT_CONTROL_BASE_SIZE + TAPROOT_CONTROL_NODE_SIZE * leaf.merkle_branch.size());
            control_block[0] = leaf.leaf_version | (m_parity ? 1 : 0);
            std::copy(m_internal_key.begin(), m_internal_key.end(), control_block.begin() + 1);
            if (leaf.merkle_branch.size()) {
                std::copy(leaf.merkle_branch[0].begin(),
                          leaf.merkle_branch[0].begin() + TAPROOT_CONTROL_NODE_SIZE * leaf.merkle_branch.size(),
                          control_block.begin() + TAPROOT_CONTROL_BASE_SIZE);
            }
            spd.scripts[{leaf.script, leaf.leaf_version}].insert(std::move(control_block));
        }
    }
    return spd;
}